

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  bool bVar1;
  TokenType TVar2;
  TokenType TVar3;
  Result RVar4;
  Script *script;
  tuple<wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_> __s;
  TokenTypePair pair;
  long lVar5;
  long *plVar6;
  _Head_base<0UL,_wabt::ModuleCommand_*,_false> local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_70 [32];
  long *local_50 [2];
  long local_40 [2];
  
  script = (Script *)operator_new(0x50);
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  *(undefined8 *)
   &(script->module_bindings).
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy = 0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets =
       &(script->module_bindings).
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_single_bucket;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 1;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  TVar2 = Peek(this,0);
  TVar3 = Peek(this,1);
  pair._M_elems[1] = TVar3;
  pair._M_elems[0] = TVar2;
  bVar1 = anon_unknown_1::IsModuleField(pair);
  if (bVar1) {
    __s.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>)
         operator_new(0x380);
    memset((void *)__s.
                   super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                   .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl,0,0x370);
    *(undefined ***)
     __s.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
     super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl = &PTR__ModuleCommand_0019c9b8
    ;
    (((Module *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x10))->loc).
    filename._M_len = 0;
    *(char **)((long)__s.
                     super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                     .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x18) =
         (char *)0x0;
    *(undefined8 *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1c) = 0;
    *(undefined8 *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x24) = 0;
    (((string *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x30))->_M_dataplus)
    ._M_p = (pointer)((long)__s.
                            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x40
                     );
    ((ModuleFieldList *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x50))->first_ =
         (ModuleField *)0x0;
    *(ModuleField **)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x58) =
         (ModuleField *)0x0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x60) = 0;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                    .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x68) = 0;
    *(undefined8 *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x6c) = 0;
    *(undefined8 *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x74) = 0;
    memset((vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *)
           ((long)__s.
                  super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                  .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x80),0,0x108)
    ;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x188))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1b8);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 400) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x198))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1a0) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1a8))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1b0) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1b8) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1c0))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1f0);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1c8) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1d0))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1d8) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1e0))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1e8) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1f0) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x1f8))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x228);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x200) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x208))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x210) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x218))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x220) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x228) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x230))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x260);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x238) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x240))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x248) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x250))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 600) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x260) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x268))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x298);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x270) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x278))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x280) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x288))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x290) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x298) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2a0))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2d0);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2a8) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2b0))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2b8) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2c0))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2c8) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2d0) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2d8))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x308);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2e0) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2e8))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2f0) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x2f8))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x300) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x308) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x310))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x340);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x318) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 800))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x328) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x330))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x338) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x340) =
         (__node_base_ptr)0x0;
    (((BindingHash *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x348))->
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    )._M_h._M_buckets =
         (__node_base_ptr *)
         ((long)__s.
                super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x378);
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x350) = 1;
    ((__node_base *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x358))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x360) = 0;
    ((_Prime_rehash_policy *)
    ((long)__s.
           super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
           super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x368))->
    _M_max_load_factor = 1.0;
    *(size_t *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x370) = 0;
    *(__node_base_ptr *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x378) =
         (__node_base_ptr)0x0;
    local_88._M_head_impl =
         (ModuleCommand *)
         __s.
         super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
         super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl;
    GetToken((Token *)local_70,this);
    (((anon_union_16_2_ecfd7102_for_Location_1 *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x20))->field_1).
    offset = local_70._16_8_;
    *(undefined8 *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x28) =
         local_70._24_8_;
    (((Module *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x10))->loc).
    filename._M_len = local_70._0_8_;
    *(undefined8 *)
     ((long)__s.
            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x18) =
         local_70._8_8_;
    RVar4 = ParseModuleFieldList
                      (this,(Module *)
                            ((long)__s.
                                   super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                                   .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl
                            + 0x10));
    if (RVar4.enum_ == Error) {
      (**(code **)(*(long *)__s.
                            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 8))
                (__s.
                 super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                 .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
      goto LAB_00138d6b;
    }
    std::
    vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
    ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
              ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                *)script,
               (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
               &local_88);
    if (local_88._M_head_impl != (ModuleCommand *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
      goto joined_r0x00138c68;
    }
  }
  else {
    TVar2 = Peek(this,0);
    TVar3 = Peek(this,1);
    if (((TVar2 == Lpar) && (TVar3 < Result)) && ((0x44232001fcU >> ((ulong)TVar3 & 0x3f) & 1) != 0)
       ) {
      RVar4 = ParseCommandList(this,script,(CommandPtrVector *)script);
joined_r0x00138c68:
      if (RVar4.enum_ == Error) goto LAB_00138d6b;
    }
    else {
      Match(this,Lpar);
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a module field","");
      plVar6 = local_40;
      local_50[0] = plVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a command","");
      local_88._M_head_impl = (ModuleCommand *)0x0;
      uStack_80 = 0;
      local_78 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (string *)local_70,&stack0xffffffffffffffd0);
      ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_88,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      lVar5 = -0x40;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -4;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
    }
  }
  RVar4 = Expect(this,Eof);
  if ((RVar4.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               script);
    return (Result)Ok;
  }
LAB_00138d6b:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 *)&script->module_bindings);
  std::
  vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ::~vector((vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
             *)script);
  operator_delete(script,0x50);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = std::make_unique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = std::make_unique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}